

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O1

void aom_smooth_v_predictor_16x64_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  int c;
  long lVar2;
  long lVar3;
  long lVar4;
  byte local_24 [3];
  uint8_t local_21;
  uint8_t weights [2];
  uint8_t pixels [2];
  
  local_21 = left[0x3f];
  lVar3 = 0;
  do {
    local_24[0] = smooth_weights[lVar3 + 0x3c];
    lVar2 = 0;
    do {
      local_24[2] = above[lVar2];
      local_24[1] = -local_24[0];
      lVar4 = 0;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + (uint)local_24[lVar4 + 2] * (uint)local_24[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 == 1);
      dst[lVar2] = (uint8_t)((uint)(iVar1 + 0x80) >> 8);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    dst = dst + stride;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

static inline void smooth_v_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint8_t *above,
                                      const uint8_t *left) {
  const uint8_t below_pred = left[bh - 1];  // estimated by bottom-left pixel
  const uint8_t *const sm_weights = smooth_weights + bh - 4;
  // scale = 2^SMOOTH_WEIGHT_LOG2_SCALE
  const int log2_scale = SMOOTH_WEIGHT_LOG2_SCALE;
  const uint16_t scale = (1 << SMOOTH_WEIGHT_LOG2_SCALE);
  sm_weights_sanity_checks(sm_weights, sm_weights, scale,
                           log2_scale + sizeof(*dst));

  int r;
  for (r = 0; r < bh; r++) {
    int c;
    for (c = 0; c < bw; ++c) {
      const uint8_t pixels[] = { above[c], below_pred };
      const uint8_t weights[] = { sm_weights[r], scale - sm_weights[r] };
      uint32_t this_pred = 0;
      assert(scale >= sm_weights[r]);
      int i;
      for (i = 0; i < 2; ++i) {
        this_pred += weights[i] * pixels[i];
      }
      dst[c] = divide_round(this_pred, log2_scale);
    }
    dst += stride;
  }
}